

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O1

void R_DrawVoxel(FVector3 *globalpos,FAngle *viewangle,FVector3 *dasprpos,DAngle *dasprang,
                fixed_t daxscale,fixed_t dayscale,FVoxel *voxobj,lighttable_t *colormap,
                short *daumost,short *dadmost,int minslabz,int maxslabz,int flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  byte bVar7;
  short sVar8;
  short sVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int stop;
  fixed_t v;
  BYTE *pBVar13;
  short *psVar14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [12];
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  ulong uVar35;
  FVoxelMipLevel *pFVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  uint uVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  uint uVar45;
  int iVar46;
  uint uVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  uint uVar54;
  int dy;
  int iVar55;
  ulong uVar56;
  int iVar57;
  int iVar58;
  byte bVar59;
  int iVar60;
  uint uVar61;
  uint uVar62;
  long lVar63;
  long lVar64;
  uint uVar65;
  int iVar66;
  int iVar67;
  long lVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  uint uVar72;
  long lVar73;
  byte *pbVar74;
  uint uVar75;
  long lVar76;
  int vi;
  int iVar77;
  int iVar78;
  long lVar79;
  int iVar80;
  long lVar81;
  int iVar82;
  int iVar83;
  undefined8 uStack_510;
  int aiStack_508 [2];
  int z1a [64];
  int z2a [64];
  int yplc [64];
  int local_1a8;
  int local_180;
  byte local_14c;
  long local_128;
  long local_108;
  int local_d0;
  ulong local_c0;
  ulong local_b8;
  int local_90;
  uint local_4c;
  int local_34;
  
  iVar27 = centerxwide;
  if (0x2ff < dayscale && 0x2ff < daxscale) {
    dVar17 = (double)centerxwide;
    dVar22 = dVar17 * 0.00625 * YaspectMul;
    fVar1 = globalpos->X;
    fVar2 = globalpos->Y;
    fVar3 = globalpos->Z;
    fVar4 = dasprpos->X;
    fVar5 = dasprpos->Y;
    fVar6 = dasprpos->Z;
    uVar31 = daxscale / 0x300;
    uVar75 = dayscale / 0x300;
    uStack_510 = 0x31639b;
    dVar18 = FFastTrig::cos(&fasttrig,
                            (double)viewangle->Degrees * 11930464.711111112 + 6755399441055744.0);
    uStack_510 = 0x3163dd;
    dVar19 = FFastTrig::sin(&fasttrig,
                            (double)viewangle->Degrees * 11930464.711111112 + 6755399441055744.0);
    uStack_510 = 0x316421;
    dVar20 = FFastTrig::cos(&fasttrig,dasprang->Degrees * 11930464.711111112 + 6755399441055744.0);
    uStack_510 = 0x316450;
    dVar21 = FFastTrig::sin(&fasttrig,dasprang->Degrees * 11930464.711111112 + 6755399441055744.0);
    uStack_510 = 0x316461;
    R_SetupDrawSlabC(colormap);
    iVar60 = SUB84((double)fVar4 + 422212465065984.0,0);
    iVar39 = SUB84((double)fVar1 + 422212465065984.0,0);
    iVar29 = iVar60 - iVar39;
    local_90 = SUB84(422212465065984.0 - (double)fVar2,0);
    iVar57 = SUB84(422212465065984.0 - (double)fVar5,0);
    iVar69 = iVar57 - local_90;
    lVar48 = (long)(SUB84((double)(float)dVar18 + 103079215104.0,0) >> 2);
    lVar73 = (long)(SUB84(103079215104.0 - (double)(float)dVar19,0) >> 2);
    uVar49 = (ulong)(iVar69 * lVar73 + iVar29 * lVar48) >> 6;
    iVar40 = (int)uVar49;
    uVar35 = (ulong)(uint)-iVar40;
    if (0 < iVar40) {
      uVar35 = uVar49 & 0xffffffff;
    }
    uVar30 = uVar75;
    if ((int)uVar31 < (int)uVar75) {
      uVar30 = uVar31;
    }
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar35 << 6;
    uVar35 = SUB168(auVar16 / ZEXT416(uVar30),0);
    iVar40 = SUB84(FocalLengthX + 824633720832.0,0);
    iVar52 = 0;
    if (iVar40 <= SUB164(auVar16 / ZEXT416(uVar30),0)) {
      iVar77 = voxobj->NumMips;
      iVar51 = 0;
      if (iVar77 < 1) {
        iVar77 = 0;
        iVar51 = 0;
      }
      do {
        iVar52 = iVar77;
        if (iVar77 == iVar51) break;
        uVar30 = (int)uVar35 >> 1;
        uVar35 = (ulong)uVar30;
        iVar51 = iVar51 + 1;
        iVar52 = iVar51;
      } while (iVar40 <= (int)uVar30);
    }
    iVar40 = voxobj->NumMips + -1;
    if (iVar52 < voxobj->NumMips) {
      iVar40 = iVar52;
    }
    if (voxobj->Mips[iVar40].SlabData != (BYTE *)0x0) {
      iVar77 = SUB84(103079215104.0 - dVar21,0) >> 2;
      pFVar36 = voxobj->Mips + iVar40;
      bVar59 = (byte)iVar40;
      uVar65 = minslabz >> (bVar59 & 0x1f);
      iVar52 = maxslabz >> (bVar59 & 0x1f);
      uVar75 = uVar75 << (bVar59 + 8 & 0x1f);
      uVar30 = -uVar75;
      if (0 < (int)uVar75) {
        uVar30 = uVar75;
      }
      uVar41 = SUB84(BaseYaspectMul + 103079215104.0,0);
      uVar43 = -uVar41;
      if (0 < (int)uVar41) {
        uVar43 = uVar41;
      }
      if (uVar30 >> 0xf < uVar43) {
        uVar30 = (uint)(((long)(int)uVar75 << 0x10) / (long)(int)uVar41);
      }
      else {
        uVar30 = 0x7fffffff - ((int)(uVar75 ^ uVar41) >> 0x1f);
      }
      lVar63 = (long)SUB84(dVar22 + 103079215104.0,0);
      iVar51 = (int)(((int)((double)(int)(uVar31 << (bVar59 + 8 & 0x1f)) / YaspectMul) * lVar63) /
                    (long)(centerxwide << 9));
      iVar82 = (int)(voxobj->Mips[iVar40].Pivot.X * 256.0);
      iVar80 = (int)(voxobj->Mips[iVar40].Pivot.Y * 256.0);
      lVar64 = (long)(int)(0x40000000 / (long)iVar51);
      lVar68 = (long)(int)((ulong)((iVar39 - iVar60) * lVar64) >> 0x10);
      lVar79 = (long)(SUB84(dVar20 + 103079215104.0,0) >> 2);
      lVar64 = (long)(int)((ulong)((local_90 - iVar57) * lVar64) >> 0x10);
      iVar57 = (int)((ulong)(lVar64 * iVar77 + lVar68 * lVar79) >> 10) + iVar82 >> 8;
      iVar78 = (int)((ulong)(-iVar77 * lVar68 + lVar64 * lVar79) >> 10) + iVar80 >> 8;
      iVar60 = pFVar36->SizeX;
      iVar39 = iVar60 + -1;
      if (iVar57 < iVar60 + -1) {
        iVar39 = iVar57;
      }
      if (iVar57 < 1) {
        iVar39 = 0;
      }
      iVar70 = voxobj->Mips[iVar40].SizeY;
      iVar42 = iVar70 + -1;
      if (iVar78 < iVar70 + -1) {
        iVar42 = iVar78;
      }
      if (iVar78 < 1) {
        iVar42 = 0;
      }
      local_d0 = SUB84(26388279066624.0 - (double)fVar6,0);
      uVar43 = SUB84(26388279066624.0 - (double)fVar3,0) - local_d0;
      uVar31 = -uVar43;
      if (0 < (int)uVar43) {
        uVar31 = uVar43;
      }
      uVar41 = -uVar30;
      if (0 < (int)uVar30) {
        uVar41 = uVar30;
      }
      if (uVar31 >> 10 < uVar41) {
        uVar35 = (ulong)((long)iVar77 * (long)iVar51) >> 0xe;
        lVar64 = (long)(int)((ulong)(lVar79 * iVar51) >> 0xe);
        lVar63 = (long)(int)(0x40000000 /
                            (long)(int)(((long)(int)((ulong)(viewingrangerecip * lVar63) >> 0x10) *
                                        (long)(int)uVar75) / (long)(centerxwide << 9)));
        uVar49 = lVar73 * lVar63;
        iVar51 = (int)((ulong)(lVar48 * lVar63) >> 0x10);
        iVar29 = iVar29 - (int)((ulong)(((long)(uVar35 * -0x100000000) >> 0x20) * (long)iVar80 +
                                       lVar64 * iVar82) >> 0x12);
        lVar48 = (long)(int)uVar35;
        iVar69 = iVar69 - (int)((ulong)(iVar82 * lVar48 + iVar80 * lVar64) >> 0x12);
        iVar77 = (int)(uVar49 >> 0x10);
        dVar18 = voxobj->Mips[iVar40].Pivot.Z;
        uVar35 = (ulong)(iVar77 * lVar48 + iVar51 * lVar64) >> 10;
        if (iVar70 < iVar60) {
          iVar70 = iVar60;
        }
        uVar31 = iVar70 + 1;
        lVar73 = -((long)(int)uVar31 * 8 + 0xfU & 0xfffffffffffffff0);
        lVar63 = lVar73 + -0x508;
        lVar68 = (long)(int)uVar31 * 4 + lVar63;
        uVar41 = (uint)((ulong)(((long)((uVar49 >> 0x10) * -0x100000000) >> 0x20) * lVar64 +
                               iVar51 * lVar48) >> 10);
        uVar75 = (uint)uVar35;
        if (-1 < iVar70) {
          uVar49 = 0;
          iVar60 = 0;
          iVar80 = 0;
          do {
            *(int *)((long)aiStack_508 + uVar49 * 4 + lVar63 + 0x508) = iVar60;
            iVar60 = iVar60 + uVar41;
            *(int *)((long)aiStack_508 + uVar49 * 4 + lVar68 + 0x508) = iVar80;
            iVar80 = iVar80 + uVar75;
            uVar49 = uVar49 + 1;
          } while (uVar31 != uVar49);
        }
        uVar61 = -uVar41;
        uVar31 = uVar41;
        if ((int)uVar41 < 1) {
          uVar31 = uVar61;
        }
        uVar62 = -uVar75;
        if (0 < (int)uVar75) {
          uVar62 = uVar75;
        }
        uVar62 = uVar62 + uVar31 >> 1;
        uVar31 = 0;
        uVar49 = 0;
        local_c0 = 0;
        local_4c = 0;
        local_b8 = 0;
        iVar82 = 0;
        local_34 = 0;
        iVar60 = 0;
        iVar80 = 0;
        do {
          switch(uVar31) {
          case 0:
            local_34 = 0;
            iVar80 = 1;
            iVar60 = 1;
            iVar82 = 0;
            break;
          case 1:
            iVar82 = pFVar36->SizeX + -1;
            local_34 = 0;
            iVar60 = -1;
            iVar80 = 1;
            break;
          case 2:
            local_34 = voxobj->Mips[iVar40].SizeY + -1;
            iVar82 = 0;
            iVar60 = 1;
            iVar80 = -1;
            break;
          case 3:
            iVar82 = pFVar36->SizeX + -1;
            local_34 = voxobj->Mips[iVar40].SizeY + -1;
            iVar80 = -1;
            iVar60 = -1;
            break;
          case 4:
            iVar82 = 0;
            iVar60 = 1;
            goto LAB_00316a81;
          case 5:
            iVar82 = pFVar36->SizeX + -1;
            iVar60 = -1;
LAB_00316a81:
            iVar80 = 2;
            local_34 = iVar42;
            break;
          case 6:
            local_34 = 0;
            iVar80 = 1;
            goto LAB_00316aac;
          case 7:
            local_34 = voxobj->Mips[iVar40].SizeY + -1;
            iVar80 = -1;
LAB_00316aac:
            iVar60 = 2;
            iVar82 = iVar39;
          }
          if (uVar31 < 4) {
            if ((((-1 < iVar60) || (iVar39 < iVar82)) && ((iVar60 < 1 || (iVar82 < iVar39)))) &&
               (((-1 < iVar80 || (iVar42 < local_34)) &&
                ((iVar70 = iVar42, iVar44 = iVar39, iVar80 < 1 || (local_34 < iVar42)))))) {
LAB_00316b75:
              uVar45 = (uint)(local_34 != iVar78);
              if (local_34 < iVar78) {
                uVar45 = 0xffffffff;
              }
              iVar53 = (uint)(iVar82 != iVar57) * 3;
              if (iVar82 < iVar57) {
                iVar53 = -3;
              }
              uVar32 = (uint)uVar49;
              switch(iVar53 + uVar45) {
              case 1:
              case 4:
                uVar32 = uVar41;
                local_c0 = uVar35;
                break;
              case 2:
              case 3:
                local_c0 = 0;
                uVar32 = 0;
                break;
              case 0xfffffffc:
              case 0xffffffff:
                local_c0 = (ulong)uVar61;
                uVar32 = uVar75;
                break;
              case 0xfffffffd:
              case 0xfffffffe:
                uVar32 = uVar41 + uVar75;
                local_c0 = (ulong)(uVar75 - uVar41);
              }
              switch(iVar53 + uVar45) {
              case 3:
              case 4:
                local_b8 = (ulong)uVar61;
                local_4c = uVar75;
                break;
              case 0xfffffffc:
              case 0xfffffffd:
                local_b8 = uVar35;
                local_4c = uVar41;
                break;
              case 0xfffffffe:
              case 1:
                local_b8 = 0;
                local_4c = 0;
                break;
              case 0xffffffff:
              case 2:
                local_b8 = (ulong)(uVar75 - uVar41);
                local_4c = uVar41 + uVar75;
              }
              if (iVar80 < 1) {
                local_1a8 = -(int)((ulong)((long)viewingrangerecip * (long)(int)uVar75) >> 0x10);
                uVar45 = uVar61;
              }
              else {
                local_1a8 = (int)((ulong)((long)viewingrangerecip * (long)(int)uVar75) >> 0x10);
                uVar45 = uVar41;
              }
              lVar48 = (long)viewingrangerecip;
              uVar50 = (int)uVar32 * lVar48;
              uVar49 = uVar50 >> 0x10;
              if (iVar82 == iVar44) {
                uVar49 = uVar49 & 0xffffffff;
              }
              else {
                bVar59 = (local_34 < iVar78) << 2 | '\x01' << (iVar82 < iVar57);
                local_14c = bVar59 + 4;
                lVar64 = (long)local_34;
                iVar53 = *(int *)((long)aiStack_508 + lVar64 * 4 + lVar68 + 0x508);
                iVar10 = *(int *)((long)aiStack_508 + lVar64 * 4 + lVar63 + 0x508);
                local_108 = (long)iVar82;
                do {
                  if (local_34 != iVar70) {
                    iVar11 = voxobj->Mips[iVar40].OffsetX[local_108];
                    pBVar13 = voxobj->Mips[iVar40].SlabData;
                    lVar79 = ((long)voxobj->Mips[iVar40].SizeY + 1) * local_108;
                    psVar14 = voxobj->Mips[iVar40].OffsetXY;
                    iVar66 = *(int *)((long)aiStack_508 + local_108 * 4 + lVar68 + 0x508) +
                             ((iVar29 * iVar51 + iVar69 * iVar77) - iVar10);
                    local_180 = (int)(uVar50 >> 0x10);
                    local_180 = (int)((ulong)(((long)*(int *)((long)aiStack_508 +
                                                             local_108 * 4 + lVar63 + 0x508) +
                                              (long)iVar53 +
                                              (long)(iVar69 * iVar51 - iVar29 * iVar77)) *
                                             (long)viewingrangerecip) >> 0x10) + local_180;
                    local_128 = lVar64;
                    do {
                      if (iVar66 < 0x3ff00000 && iVar27 * 0x834 < iVar66) {
                        sVar8 = psVar14[lVar79 + local_128];
                        sVar9 = psVar14[lVar79 + local_128 + 1];
                        if (sVar8 < sVar9) {
                          iVar33 = SUB84(((double)local_180 * dVar17) /
                                         (double)((int)local_c0 + iVar66) + 6755399441055744.0,0) +
                                   centerx;
                          if (iVar33 < 1) {
                            iVar33 = 0;
                          }
                          iVar46 = SUB84(((double)(local_180 +
                                                  (int)((ulong)(lVar48 * (int)(local_4c - uVar32))
                                                       >> 0x10)) * dVar17) /
                                         (double)((int)local_b8 + iVar66) + 6755399441055744.0,0) +
                                   centerx;
                          if (viewwidth <= iVar46) {
                            iVar46 = viewwidth;
                          }
                          if (iVar33 < iVar46) {
                            iVar67 = viewwidth - iVar46;
                            iVar26 = viewwidth - iVar33;
                            if ((flags & 4U) == 0) {
                              iVar67 = iVar33;
                              iVar26 = iVar46;
                            }
                            if (sVar8 < sVar9) {
                              pbVar74 = pBVar13 + (long)sVar8 + (long)iVar11;
                              lVar37 = (long)SUB84((dVar17 * 34359738368.0) /
                                                   (double)(int)(iVar66 + uVar62) +
                                                   6755399441055744.0,0);
                              lVar38 = (long)SUB84((dVar17 * 34359738368.0) /
                                                   (double)(int)(iVar66 - uVar62) +
                                                   6755399441055744.0,0);
                              uVar47 = iVar26 - iVar67;
                              if (0x3f < (int)uVar47) {
                                uVar47 = 0x40;
                              }
                              do {
                                bVar7 = *pbVar74;
                                iVar33 = uVar65 - bVar7;
                                uVar34 = uVar65;
                                if (iVar33 == 0 || (int)uVar65 < (int)(uint)bVar7) {
                                  iVar33 = 0;
                                  uVar34 = (uint)bVar7;
                                }
                                iVar46 = ((uint)pbVar74[1] - iVar33) + uVar34;
                                iVar71 = iVar52 - iVar46;
                                if (iVar46 <= iVar52) {
                                  iVar71 = 0;
                                }
                                uVar72 = iVar71 + ((uint)pbVar74[1] - iVar33);
                                if (0 < (int)uVar72) {
                                  uVar34 = uVar34 * 0x8000 -
                                           ((int)(dVar18 * 256.0) * 0x80 +
                                           (int)(((long)(int)uVar43 << 0x15) /
                                                ((long)(int)uVar30 * 0xe8000000 >> 0x20)));
                                  if ((int)uVar34 < 0) {
                                    uVar54 = uVar72 * 0x8000 + uVar34;
                                    if ((int)uVar54 < 0) {
                                      if ((bVar59 + 0x24 & pbVar74[2]) != 0) {
                                        iVar46 = (int)((ulong)((int)uVar54 * lVar37) >> 0x20);
                                        goto LAB_003170f4;
                                      }
                                    }
                                    else if ((local_14c & pbVar74[2]) != 0) {
                                      iVar46 = (int)((ulong)uVar54 * lVar38 >> 0x20);
LAB_003170f4:
                                      iVar71 = (int)((ulong)((int)uVar34 * lVar38) >> 0x20);
                                      goto LAB_00317112;
                                    }
                                  }
                                  else if ((pbVar74[2] & bVar59 + 0x14) != 0) {
                                    iVar71 = (int)((ulong)uVar34 * lVar37 >> 0x20);
                                    iVar46 = (int)((ulong)((int)(uVar72 * 0x8000 + uVar34) * lVar38)
                                                  >> 0x20);
LAB_00317112:
                                    iVar71 = iVar71 + centery;
                                    iVar46 = iVar46 + centery;
                                    uVar34 = iVar46 - iVar71;
                                    if (uVar34 != 0 && iVar71 <= iVar46) {
                                      vi = 0;
                                      if (uVar72 != 1) {
                                        if ((int)uVar34 < 0x400) {
                                          vi = (int)((int)(0xffffff / (long)(int)uVar34) * uVar72)
                                               >> 8;
                                        }
                                        else {
                                          vi = 0x7fffffff;
                                          if (uVar72 >> 0xf < uVar34) {
                                            auVar15._4_8_ = 0;
                                            auVar15._0_4_ = uVar34;
                                            auVar23._4_8_ = 0;
                                            auVar23._0_4_ = uVar72;
                                            vi = SUB124((auVar23 << 0x10) / auVar15,0);
                                          }
                                        }
                                      }
                                      if (iVar67 < iVar26) {
                                        uVar34 = uVar47;
                                        iVar55 = iVar67;
                                        do {
                                          if (0 < (int)uVar34) {
                                            uVar56 = 0;
                                            do {
                                              if (uVar72 == 1) {
                                                z2a[uVar56 + 0x3e] = 0;
                                                iVar83 = (int)daumost[(long)iVar55 + uVar56];
                                                if (daumost[(long)iVar55 + uVar56] < iVar71) {
                                                  iVar83 = iVar71;
                                                }
                                              }
                                              else {
                                                iVar83 = (int)daumost[(long)iVar55 + uVar56];
                                                if (iVar83 - iVar71 == 0 || iVar83 < iVar71) {
                                                  z2a[uVar56 + 0x3e] = 0;
                                                  iVar83 = iVar71;
                                                }
                                                else {
                                                  z2a[uVar56 + 0x3e] = (iVar83 - iVar71) * vi;
                                                }
                                              }
                                              aiStack_508[uVar56] = iVar83;
                                              iVar83 = (int)dadmost[(long)iVar55 + uVar56];
                                              if (iVar46 < dadmost[(long)iVar55 + uVar56]) {
                                                iVar83 = iVar46;
                                              }
                                              z1a[uVar56 + 0x3e] = iVar83;
                                              uVar56 = uVar56 + 1;
                                            } while (uVar56 < uVar34);
                                          }
                                          if (0 < (int)uVar34) {
                                            iVar83 = 0;
                                            do {
                                              lVar81 = (long)iVar83;
                                              iVar12 = aiStack_508[lVar81];
                                              stop = z1a[lVar81 + 0x3e];
                                              dy = stop - iVar12;
                                              iVar24 = iVar83;
                                              if (dy != 0 && iVar12 <= stop) {
                                                lVar28 = 0;
                                                iVar24 = 1;
                                                do {
                                                  iVar58 = iVar24;
                                                  lVar76 = lVar28;
                                                  if (((long)(ulong)uVar34 <= lVar81 + 1 + lVar76)
                                                     || (z1a[lVar81 + lVar76 + -1] != iVar12))
                                                  break;
                                                  lVar28 = lVar76 + 1;
                                                  iVar24 = iVar58 + 1;
                                                } while (z1a[lVar81 + lVar76 + 0x3f] == stop);
                                                iVar25 = (int)lVar76;
                                                iVar24 = iVar83 + iVar25;
                                                if ((flags & 1U) == 0) {
                                                  iVar12 = ylookup[iVar12];
                                                  v = z2a[lVar81 + 0x3e];
                                                  *(undefined8 *)((long)&uStack_510 + lVar73) =
                                                       0x317309;
                                                  R_DrawSlabC(iVar25 + 1,v,dy,vi,
                                                              pbVar74 + (long)iVar33 + 3,
                                                              dc_destorg +
                                                              (iVar83 + iVar55 + iVar12));
                                                }
                                                else {
                                                  dc_yh = stop + -1;
                                                  dc_yl = iVar12;
                                                  dc_iscale = vi;
                                                  dc_count = dy;
                                                  if (iVar83 <= iVar83 + iVar25) {
                                                    iVar83 = iVar83 + iVar55;
                                                    do {
                                                      *(undefined8 *)((long)&uStack_510 + lVar73) =
                                                           0x317377;
                                                      FCoverageBuffer::InsertSpan
                                                                (OffscreenCoverageBuffer,iVar83,
                                                                 iVar12,stop);
                                                      if ((flags & 2U) == 0) {
                                                        *(undefined8 *)((long)&uStack_510 + lVar73)
                                                             = 0x3173a6;
                                                        dc_x = iVar83;
                                                        rt_initcols(OffscreenColorBuffer +
                                                                    (long)OffscreenBufferHeight *
                                                                    ((long)iVar83 &
                                                                    0xfffffffffffffffcU));
                                                        dc_texturefrac = z2a[lVar81 + 0x3e];
                                                        *(undefined8 *)((long)&uStack_510 + lVar73)
                                                             = 0x3173d1;
                                                        dc_source = pbVar74 + (long)iVar33 + 3;
                                                        (*hcolfunc_pre)();
                                                      }
                                                      iVar83 = iVar83 + 1;
                                                      iVar58 = iVar58 + -1;
                                                    } while (iVar58 != 0);
                                                  }
                                                }
                                              }
                                              iVar83 = iVar24 + 1;
                                            } while (iVar83 < (int)uVar34);
                                          }
                                          iVar55 = iVar55 + 0x40;
                                          uVar34 = iVar26 - iVar55;
                                          if (0x3f < (int)uVar34) {
                                            uVar34 = 0x40;
                                          }
                                        } while (iVar55 < iVar26);
                                      }
                                    }
                                  }
                                }
                                pbVar74 = pbVar74 + (ulong)pbVar74[1] + 3;
                              } while (pbVar74 < pBVar13 + (long)sVar9 + (long)iVar11);
                            }
                          }
                        }
                      }
                      local_128 = local_128 + iVar80;
                      local_180 = local_180 + local_1a8;
                      iVar66 = iVar66 - uVar45;
                    } while (iVar70 != (int)local_128);
                  }
                  local_108 = local_108 + iVar60;
                } while (iVar44 != (int)local_108);
              }
            }
          }
          else if (((((-1 < iVar60) || (iVar39 <= iVar82)) && ((iVar60 < 1 || (iVar82 <= iVar39))))
                   && ((-1 < iVar80 || (iVar42 <= local_34)))) &&
                  ((iVar80 < 1 || (local_34 <= iVar42)))) {
            iVar70 = iVar80 + iVar42;
            iVar44 = iVar60 + iVar39;
            goto LAB_00316b75;
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != 8);
      }
    }
  }
  return;
}

Assistant:

void R_DrawVoxel(const FVector3 &globalpos, FAngle viewangle,
	const FVector3 &dasprpos, DAngle dasprang,
	fixed_t daxscale, fixed_t dayscale, FVoxel *voxobj,
	lighttable_t *colormap, short *daumost, short *dadmost, int minslabz, int maxslabz, int flags)
{
	int i, j, k, x, y, syoff, ggxstart, ggystart, nxoff;
	fixed_t cosang, sinang, sprcosang, sprsinang;
	int backx, backy, gxinc, gyinc;
	int daxscalerecip, dayscalerecip, cnt, gxstart, gystart, dazscale;
	int lx, rx, nx, ny, x1=0, y1=0, x2=0, y2=0, yinc=0;
	int yoff, xs=0, ys=0, xe, ye, xi=0, yi=0, cbackx, cbacky, dagxinc, dagyinc;
	kvxslab_t *voxptr, *voxend;
	FVoxelMipLevel *mip;
	int z1a[64], z2a[64], yplc[64];

	const int nytooclose = centerxwide * 2100, nytoofar = 32768*32768 - 1048576;
	const int xdimenscale = FLOAT2FIXED(centerxwide * YaspectMul / 160);
	const double centerxwide_f = centerxwide;
	const double centerxwidebig_f = centerxwide_f * 65536*65536*8;

	// Convert to Build's coordinate system.
	fixed_t globalposx = xs_Fix<4>::ToFix(globalpos.X);
	fixed_t globalposy = xs_Fix<4>::ToFix(-globalpos.Y);
	fixed_t globalposz = xs_Fix<8>::ToFix(-globalpos.Z);

	fixed_t dasprx = xs_Fix<4>::ToFix(dasprpos.X);
	fixed_t daspry = xs_Fix<4>::ToFix(-dasprpos.Y);
	fixed_t dasprz = xs_Fix<8>::ToFix(-dasprpos.Z);

	// Shift the scales from 16 bits of fractional precision to 6.
	// Also do some magic voodoo scaling to make them the right size.
	daxscale = daxscale / (0xC000 >> 6);
	dayscale = dayscale / (0xC000 >> 6);
	if (daxscale <= 0 || dayscale <= 0)
	{
		// won't be visible.
		return;
	}

	angle_t viewang = viewangle.BAMs();
	cosang = FLOAT2FIXED(viewangle.Cos()) >> 2;
	sinang = FLOAT2FIXED(-viewangle.Sin()) >> 2;
	sprcosang = FLOAT2FIXED(dasprang.Cos()) >> 2;
	sprsinang = FLOAT2FIXED(-dasprang.Sin()) >> 2;

	R_SetupDrawSlab(colormap);

	// Select mip level
	i = abs(DMulScale6(dasprx - globalposx, cosang, daspry - globalposy, sinang));
	i = DivScale6(i, MIN(daxscale, dayscale));
	j = xs_Fix<13>::ToFix(FocalLengthX);
	for (k = 0; i >= j && k < voxobj->NumMips; ++k)
	{
		i >>= 1;
	}
	if (k >= voxobj->NumMips) k = voxobj->NumMips - 1;

	mip = &voxobj->Mips[k];		if (mip->SlabData == NULL) return;

	minslabz >>= k;
	maxslabz >>= k;

	daxscale <<= (k+8); dayscale <<= (k+8);
	dazscale = FixedDiv(dayscale, FLOAT2FIXED(BaseYaspectMul));
	daxscale = fixed_t(daxscale / YaspectMul);
	daxscale = Scale(daxscale, xdimenscale, centerxwide << 9);
	dayscale = Scale(dayscale, FixedMul(xdimenscale, viewingrangerecip), centerxwide << 9);

	daxscalerecip = (1<<30) / daxscale;
	dayscalerecip = (1<<30) / dayscale;

	fixed_t piv_x = fixed_t(mip->Pivot.X*256.);
	fixed_t piv_y = fixed_t(mip->Pivot.Y*256.);
	fixed_t piv_z = fixed_t(mip->Pivot.Z*256.);

	x = FixedMul(globalposx - dasprx, daxscalerecip);
	y = FixedMul(globalposy - daspry, daxscalerecip);
	backx = (DMulScale10(x, sprcosang, y,  sprsinang) + piv_x) >> 8;
	backy = (DMulScale10(y, sprcosang, x, -sprsinang) + piv_y) >> 8;
	cbackx = clamp(backx, 0, mip->SizeX - 1);
	cbacky = clamp(backy, 0, mip->SizeY - 1);

	sprcosang = MulScale14(daxscale, sprcosang);
	sprsinang = MulScale14(daxscale, sprsinang);

	x = (dasprx - globalposx) - DMulScale18(piv_x, sprcosang, piv_y, -sprsinang);
	y = (daspry - globalposy) - DMulScale18(piv_y, sprcosang, piv_x,  sprsinang);

	cosang = FixedMul(cosang, dayscalerecip);
	sinang = FixedMul(sinang, dayscalerecip);

	gxstart = y*cosang - x*sinang;
	gystart = x*cosang + y*sinang;
	gxinc = DMulScale10(sprsinang, cosang, sprcosang, -sinang);
	gyinc = DMulScale10(sprcosang, cosang, sprsinang,  sinang);
	if ((abs(globalposz - dasprz) >> 10) >= abs(dazscale)) return;

	x = 0; y = 0; j = MAX(mip->SizeX, mip->SizeY);
	fixed_t *ggxinc = (fixed_t *)alloca((j + 1) * sizeof(fixed_t) * 2);
	fixed_t *ggyinc = ggxinc + (j + 1);
	for (i = 0; i <= j; i++)
	{
		ggxinc[i] = x; x += gxinc;
		ggyinc[i] = y; y += gyinc;
	}

	syoff = DivScale21(globalposz - dasprz, FixedMul(dazscale, 0xE800)) + (piv_z << 7);
	yoff = (abs(gxinc) + abs(gyinc)) >> 1;

	for (cnt = 0; cnt < 8; cnt++)
	{
		switch (cnt)
		{
			case 0: xs = 0;				ys = 0;				xi =  1; yi =  1; break;
			case 1: xs = mip->SizeX-1;	ys = 0;				xi = -1; yi =  1; break;
			case 2: xs = 0;				ys = mip->SizeY-1;	xi =  1; yi = -1; break;
			case 3: xs = mip->SizeX-1;	ys = mip->SizeY-1;	xi = -1; yi = -1; break;
			case 4: xs = 0;				ys = cbacky;		xi =  1; yi =  2; break;
			case 5: xs = mip->SizeX-1;	ys = cbacky;		xi = -1; yi =  2; break;
			case 6: xs = cbackx;		ys = 0;				xi =  2; yi =  1; break;
			case 7: xs = cbackx;		ys = mip->SizeY-1;	xi =  2; yi = -1; break;
		}
		xe = cbackx; ye = cbacky;
		if (cnt < 4)
		{
			if ((xi < 0) && (xe >= xs)) continue;
			if ((xi > 0) && (xe <= xs)) continue;
			if ((yi < 0) && (ye >= ys)) continue;
			if ((yi > 0) && (ye <= ys)) continue;
		}
		else
		{
			if ((xi < 0) && (xe > xs)) continue;
			if ((xi > 0) && (xe < xs)) continue;
			if ((yi < 0) && (ye > ys)) continue;
			if ((yi > 0) && (ye < ys)) continue;
			xe += xi; ye += yi;
		}

		i = ksgn(ys-backy)+ksgn(xs-backx)*3+4;
		switch(i)
		{
			case 6: case 7: x1 = 0;				y1 = 0;				break;
			case 8: case 5: x1 = gxinc;			y1 = gyinc;			break;
			case 0: case 3: x1 = gyinc;			y1 = -gxinc;		break;
			case 2: case 1: x1 = gxinc+gyinc;	y1 = gyinc-gxinc;	break;
		}
		switch(i)
		{
			case 2: case 5: x2 = 0;				y2 = 0;				break;
			case 0: case 1: x2 = gxinc;			y2 = gyinc;			break;
			case 8: case 7: x2 = gyinc;			y2 = -gxinc;		break;
			case 6: case 3: x2 = gxinc+gyinc;	y2 = gyinc-gxinc;	break;
		}
		BYTE oand = (1 << int(xs<backx)) + (1 << (int(ys<backy)+2));
		BYTE oand16 = oand + 16;
		BYTE oand32 = oand + 32;

		if (yi > 0) { dagxinc =  gxinc; dagyinc =  FixedMul(gyinc, viewingrangerecip); }
			   else { dagxinc = -gxinc; dagyinc = -FixedMul(gyinc, viewingrangerecip); }

			/* Fix for non 90 degree viewing ranges */
		nxoff = FixedMul(x2 - x1, viewingrangerecip);
		x1 = FixedMul(x1, viewingrangerecip);

		ggxstart = gxstart + ggyinc[ys];
		ggystart = gystart - ggxinc[ys];

		for (x = xs; x != xe; x += xi)
		{
			BYTE *slabxoffs = &mip->SlabData[mip->OffsetX[x]];
			short *xyoffs = &mip->OffsetXY[x * (mip->SizeY + 1)];

			nx = FixedMul(ggxstart + ggxinc[x], viewingrangerecip) + x1;
			ny = ggystart + ggyinc[x];
			for (y = ys; y != ye; y += yi, nx += dagyinc, ny -= dagxinc)
			{
				if ((ny <= nytooclose) || (ny >= nytoofar)) continue;
				voxptr = (kvxslab_t *)(slabxoffs + xyoffs[y]);
				voxend = (kvxslab_t *)(slabxoffs + xyoffs[y+1]);
				if (voxptr >= voxend) continue;

				lx = xs_RoundToInt(nx * centerxwide_f / (ny + y1)) + centerx;
				if (lx < 0) lx = 0;
				rx = xs_RoundToInt((nx + nxoff) * centerxwide_f / (ny + y2)) + centerx;
				if (rx > viewwidth) rx = viewwidth;
				if (rx <= lx) continue;

				if (flags & DVF_MIRRORED)
				{
					int t = viewwidth - lx;
					lx = viewwidth - rx;
					rx = t;
				}

				fixed_t l1 = xs_RoundToInt(centerxwidebig_f / (ny - yoff));
				fixed_t l2 = xs_RoundToInt(centerxwidebig_f / (ny + yoff));
				for (; voxptr < voxend; voxptr = (kvxslab_t *)((BYTE *)voxptr + voxptr->zleng + 3))
				{
					const BYTE *col = voxptr->col;
					int zleng = voxptr->zleng;
					int ztop = voxptr->ztop;
					fixed_t z1, z2;

					if (ztop < minslabz)
					{
						int diff = minslabz - ztop;
						ztop = minslabz;
						col += diff;
						zleng -= diff;
					}
					if (ztop + zleng > maxslabz)
					{
						int diff = ztop + zleng - maxslabz;
						zleng -= diff;
					}
					if (zleng <= 0) continue;

					j = (ztop << 15) - syoff;
					if (j < 0)
					{
						k = j + (zleng << 15);
						if (k < 0)
						{
							if ((voxptr->backfacecull & oand32) == 0) continue;
							z2 = MulScale32(l2, k) + centery;					/* Below slab */
						}
						else
						{
							if ((voxptr->backfacecull & oand) == 0) continue;	/* Middle of slab */
							z2 = MulScale32(l1, k) + centery;
						}
						z1 = MulScale32(l1, j) + centery;
					}
					else
					{
						if ((voxptr->backfacecull & oand16) == 0) continue;
						z1 = MulScale32(l2, j) + centery;						/* Above slab */
						z2 = MulScale32(l1, j + (zleng << 15)) + centery;
					}

					if (z2 <= z1) continue;

					if (zleng == 1)
					{
						yinc = 0;
					}
					else
					{
						if (z2-z1 >= 1024) yinc = FixedDiv(zleng, z2 - z1);
						else yinc = (((1 << 24) - 1) / (z2 - z1)) * zleng >> 8;
					}
					// [RH] Clip each column separately, not just by the first one.
					for (int stripwidth = MIN<int>(countof(z1a), rx - lx), lxt = lx;
						lxt < rx;
						(lxt += countof(z1a)), stripwidth = MIN<int>(countof(z1a), rx - lxt))
					{
						// Calculate top and bottom pixels locations
						for (int xxx = 0; xxx < stripwidth; ++xxx)
						{
							if (zleng == 1)
							{
								yplc[xxx] = 0;
								z1a[xxx] = MAX<int>(z1, daumost[lxt + xxx]);
							}
							else
							{
								if (z1 < daumost[lxt + xxx])
								{
									yplc[xxx] = yinc * (daumost[lxt + xxx] - z1);
									z1a[xxx] = daumost[lxt + xxx];
								}
								else
								{
									yplc[xxx] = 0;
									z1a[xxx] = z1;
								}
							}
							z2a[xxx] = MIN<int>(z2, dadmost[lxt + xxx]);
						}
						// Find top and bottom pixels that match and draw them as one strip
						for (int xxl = 0, xxr; xxl < stripwidth; )
						{
							if (z1a[xxl] >= z2a[xxl])
							{ // No column here
								xxl++;
								continue;
							}
							int z1 = z1a[xxl];
							int z2 = z2a[xxl];
							// How many columns share the same extents?
							for (xxr = xxl + 1; xxr < stripwidth; ++xxr)
							{
								if (z1a[xxr] != z1 || z2a[xxr] != z2)
									break;
							}

							if (!(flags & DVF_OFFSCREEN))
							{
								// Draw directly to the screen.
								R_DrawSlab(xxr - xxl, yplc[xxl], z2 - z1, yinc, col, ylookup[z1] + lxt + xxl + dc_destorg);
							}
							else
							{
								// Record the area covered and possibly draw to an offscreen buffer.
								dc_yl = z1;
								dc_yh = z2 - 1;
								dc_count = z2 - z1;
								dc_iscale = yinc;
								for (int x = xxl; x < xxr; ++x)
								{
									OffscreenCoverageBuffer->InsertSpan(lxt + x, z1, z2);
									if (!(flags & DVF_SPANSONLY))
									{
										dc_x = lxt + x;
										rt_initcols(OffscreenColorBuffer + (dc_x & ~3) * OffscreenBufferHeight);
										dc_source = col;
										dc_texturefrac = yplc[xxl];
										hcolfunc_pre();
									}
								}
							}
							xxl = xxr;
						}
					}
				}
			}
		}
	}
}